

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall re2::DFA::ClearCache(DFA *this)

{
  bool bVar1;
  size_type __n;
  reference __x;
  size_type sVar2;
  reference ppSVar3;
  ulong local_50;
  size_t i;
  _Node_iterator_base<re2::DFA::State_*,_true> local_40;
  iterator it;
  undefined1 local_28 [8];
  vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> v;
  DFA *this_local;
  
  v.super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::vector
            ((vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> *)local_28);
  __n = std::
        unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
        ::size(&this->state_cache_);
  std::vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::reserve
            ((vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> *)local_28,__n);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
       ::begin(&this->state_cache_);
  while( true ) {
    i = (size_t)std::
                unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
                ::end(&this->state_cache_);
    bVar1 = std::__detail::operator!=(&local_40,(_Node_iterator_base<re2::DFA::State_*,_true> *)&i);
    if (!bVar1) break;
    __x = std::__detail::_Node_iterator<re2::DFA::State_*,_true,_true>::operator*
                    ((_Node_iterator<re2::DFA::State_*,_true,_true> *)&local_40);
    std::vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::push_back
              ((vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> *)local_28,__x);
    std::__detail::_Node_iterator<re2::DFA::State_*,_true,_true>::operator++
              ((_Node_iterator<re2::DFA::State_*,_true,_true> *)&local_40);
  }
  std::
  unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
  ::clear(&this->state_cache_);
  local_50 = 0;
  while( true ) {
    sVar2 = std::vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::size
                      ((vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> *)local_28);
    if (sVar2 <= local_50) break;
    ppSVar3 = std::vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::operator[]
                        ((vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> *)local_28,
                         local_50);
    if (*ppSVar3 != (value_type)0x0) {
      operator_delete__(*ppSVar3);
    }
    local_50 = local_50 + 1;
  }
  std::vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::~vector
            ((vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> *)local_28);
  return;
}

Assistant:

void DFA::ClearCache() {
  // In case state_cache_ doesn't support deleting entries
  // during iteration, copy into a vector and then delete.
  vector<State*> v;
  v.reserve(state_cache_.size());
  for (StateSet::iterator it = state_cache_.begin();
       it != state_cache_.end(); ++it)
    v.push_back(*it);
  state_cache_.clear();
  for (size_t i = 0; i < v.size(); i++)
    delete[] reinterpret_cast<const char*>(v[i]);
}